

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

size_t mtbdd_set_count(MTBDD set)

{
  undefined8 local_18;
  size_t result;
  MTBDD set_local;
  
  local_18 = 0;
  for (result = set; result != 0x8000000000000000; result = mtbdd_gethigh(result)) {
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

size_t
mtbdd_set_count(MTBDD set)
{
    size_t result = 0;
    while (set != mtbdd_true) {
        result++;
        set = mtbdd_gethigh(set);
    }
    return result;
}